

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkExecEntry(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  TimeDependencies *this_00;
  int32_t *piVar1;
  TimeState TVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  action_t startingAction;
  bool bVar6;
  uint8_t uVar7;
  int iVar8;
  Time TVar9;
  long lVar10;
  DependencyInfo *pDVar11;
  DependencyInfo *pDVar12;
  int32_t responseSequenceCounter;
  byte bVar13;
  GlobalFederateId GVar14;
  MessageProcessingResult MVar15;
  byte bVar16;
  ActionMessage *pAVar17;
  pointer pDVar18;
  TimeData *pTVar19;
  char cVar20;
  TimeDependencies *__range5;
  byte bVar21;
  ActionMessage execgrant;
  
  bVar21 = 0;
  if ((this->time_block).internalTimeCode < 1) {
    return CONTINUE_PROCESSING;
  }
  this_00 = &(this->super_BaseTimeCoordinator).dependencies;
  bVar6 = TimeDependencies::checkIfReadyForExecEntry
                    (this_00,this->iterating != NO_ITERATIONS,
                     (this->info).wait_for_current_time_updates);
  if (!bVar6) {
    if (this->iterating == NO_ITERATIONS) {
      return CONTINUE_PROCESSING;
    }
    if (this->hasInitUpdates != false) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
    bVar6 = TimeDependencies::checkIfReadyForExecEntry(this_00,false,false);
    if (!bVar6) {
      this->needSendAll = true;
      return CONTINUE_PROCESSING;
    }
    pDVar11 = getExecEntryMinFederate
                        (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                         NONE,(GlobalFederateId)0x8831d580);
    if (((pDVar11->fedID).gid != triggerFed.gid) &&
       (pDVar11 = TimeDependencies::getDependencyInfo(this_00,triggerFed),
       pDVar11->dependent != true)) {
      return CONTINUE_PROCESSING;
    }
    responseSequenceCounter = (pDVar11->super_TimeData).sequenceCounter;
    GVar14.gid = -2010000000;
    goto LAB_002dc0bc;
  }
  cVar20 = this->needSendAll;
  this->needSendAll = false;
  MVar15 = CONTINUE_PROCESSING;
  if (this->iterating - 1 < 2) {
    if ((this->iteration).super___atomic_base<int>._M_i < (this->info).maxIterations) {
      if (this->hasInitUpdates != false) {
        MVar15 = ITERATING;
        goto LAB_002dbe55;
      }
      bVar6 = TimeDependencies::checkIfReadyForExecEntry
                        (this_00,false,(this->info).wait_for_current_time_updates);
      if (!bVar6) {
        bVar21 = (this->info).wait_for_current_time_updates;
        if ((bool)bVar21 == true) {
          bVar6 = TimeDependencies::checkIfAllDependenciesArePastExec(this_00,true);
          if (bVar6) goto LAB_002dbe46;
          bVar21 = (this->info).wait_for_current_time_updates;
        }
        bVar13 = bVar21 ^ 1;
        bVar6 = (this->info).restrictive_time_policy;
        bVar16 = bVar6;
        if ((bVar21 & 1) == 0) {
          iVar8 = (this->super_BaseTimeCoordinator).sequenceCounter;
          bVar21 = 0x32;
          for (pDVar18 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                         super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pDVar18 !=
              (this->super_BaseTimeCoordinator).dependencies.dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish; pDVar18 = pDVar18 + 1) {
            if (pDVar18->dependency == true) {
              TVar2 = (pDVar18->super_TimeData).mTimeState;
              if (TVar2 == initialized) goto LAB_002dbe55;
              if (TVar2 < exec_requested) {
                iVar4 = (pDVar18->super_TimeData).responseSequenceCounter;
                if ((pDVar18->super_TimeData).minFed.gid !=
                    (this->super_BaseTimeCoordinator).mSourceId.gid) {
                  bVar13 = 0;
                }
                if ((iVar4 == iVar8 & bVar6) == 1) {
                  bVar3 = (pDVar18->super_TimeData).restrictionLevel;
                  if (bVar3 <= bVar21) {
                    bVar21 = bVar3;
                  }
                }
                else if (iVar4 != iVar8) {
                  bVar13 = 0;
                  bVar16 = 0;
                  break;
                }
              }
            }
          }
        }
        else {
          bVar21 = 0x32;
        }
        if ((bVar13 & 1) == 0) {
          if (bVar16 != 0) {
            uVar7 = bVar21 + 1;
LAB_002dc1bd:
            this->currentRestrictionLevel = uVar7;
            piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
            *piVar1 = *piVar1 + 1;
            cVar20 = '\x01';
          }
        }
        else {
          if ((bVar6 == false) || (bVar21 != 0)) goto LAB_002dbe46;
          uVar7 = '\x01';
          if (this->currentRestrictionLevel != '\x01') goto LAB_002dc1bd;
        }
        goto LAB_002dbe55;
      }
    }
LAB_002dbe46:
    MVar15 = (this->iterating == FORCE_ITERATION) * '\x02';
LAB_002dbe55:
    if (this->dynamicJoining == false) {
      if (MVar15 == ITERATING) {
        TimeDependencies::resetIteratingExecRequests(this_00);
        this->hasInitUpdates = false;
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i =
             (this->iteration).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        ActionMessage::ActionMessage(&execgrant,cmd_exec_grant);
        execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        execgrant.counter = (uint16_t)(this->iteration).super___atomic_base<int>._M_i;
        execgrant.source_handle.hid = 1;
        execgrant.flags._0_1_ = (byte)execgrant.flags | 1;
        transmitTimingMessages(this,&execgrant,(GlobalFederateId)0x8831d580);
        this->currentRestrictionLevel = '\0';
        ActionMessage::~ActionMessage(&execgrant);
        MVar15 = ITERATING;
      }
      else if (MVar15 == NEXT_STEP) {
LAB_002dbf46:
        (this->time_granted).internalTimeCode = 0;
        (this->time_grantBase).internalTimeCode = 0;
        (this->super_BaseTimeCoordinator).executionMode = true;
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i = 0;
        UNLOCK();
        this->currentRestrictionLevel = '\0';
        ActionMessage::ActionMessage(&execgrant,cmd_exec_grant);
        execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        execgrant.source_handle.hid = 1;
        transmitTimingMessages(this,&execgrant,(GlobalFederateId)0x8831d580);
        goto LAB_002dc007;
      }
    }
    else if (MVar15 == NEXT_STEP) goto LAB_002dbf01;
  }
  else {
    if (this->iterating != NO_ITERATIONS) goto LAB_002dbe55;
    if ((this->info).wait_for_current_time_updates == true) {
      GVar14.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      generateMinTimeTotal
                ((TimeData *)&execgrant,this_00,
                 (bool)((this->globalTime | (this->info).restrictive_time_policy) & 1),GVar14,GVar14
                 ,(this->super_BaseTimeCoordinator).sequenceCounter);
      pAVar17 = &execgrant;
      pTVar19 = &this->total;
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pTVar19->next).internalTimeCode = *(baseType *)pAVar17;
        pAVar17 = (ActionMessage *)((long)pAVar17 + ((ulong)bVar21 * -2 + 1) * 8);
        pTVar19 = (TimeData *)((long)pTVar19 + (ulong)bVar21 * -0x10 + 8);
      }
      MVar15 = (0 < (this->total).next.internalTimeCode) * '\x02' + CONTINUE_PROCESSING;
      goto LAB_002dbe55;
    }
    if (this->dynamicJoining == false) goto LAB_002dbf46;
LAB_002dbf01:
    (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])(this);
    iVar8 = BaseTimeCoordinator::dependencyCount(&this->super_BaseTimeCoordinator);
    if (iVar8 < 1) {
      lVar10 = 0;
    }
    else {
      TVar9 = generateAllowedTime(this,(this->total).next.internalTimeCode);
      lVar10 = (this->info).timeDelta.internalTimeCode;
      lVar5 = (this->info).period.internalTimeCode;
      if (lVar10 < lVar5) {
        lVar10 = lVar5;
      }
      lVar10 = TVar9.internalTimeCode - lVar10;
    }
    (this->time_granted).internalTimeCode = lVar10;
    (this->time_grantBase).internalTimeCode = lVar10;
    (this->super_BaseTimeCoordinator).executionMode = true;
    LOCK();
    (this->iteration).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    this->currentRestrictionLevel = '\0';
    startingAction = cmd_exec_grant;
    if (0 < lVar10) {
      startingAction = cmd_time_grant;
    }
    ActionMessage::ActionMessage(&execgrant,startingAction);
    execgrant.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    execgrant.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
    execgrant.source_handle.hid = 1;
    transmitTimingMessages(this,&execgrant,(GlobalFederateId)0x8831d580);
LAB_002dc007:
    ActionMessage::~ActionMessage(&execgrant);
    MVar15 = NEXT_STEP;
  }
  if (triggerFed.gid == -2010000000) {
    return MVar15;
  }
  if (triggerFed.gid == -1700000000) {
    return MVar15;
  }
  if (MVar15 != CONTINUE_PROCESSING) {
    return MVar15;
  }
  if (this->iterating == NO_ITERATIONS) {
    return CONTINUE_PROCESSING;
  }
  pDVar11 = getExecEntryMinFederate
                      (this_00,(GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                       NONE,(GlobalFederateId)0x8831d580);
  if (cVar20 != '\0') {
    sendUpdatedExecRequest
              (this,(GlobalFederateId)0x8831d580,(GlobalFederateId)(pDVar11->fedID).gid,
               (pDVar11->super_TimeData).sequenceCounter);
    return CONTINUE_PROCESSING;
  }
  if ((this->super_BaseTimeCoordinator).mSourceId.gid == triggerFed.gid) {
    return CONTINUE_PROCESSING;
  }
  if (((pDVar11->fedID).gid == triggerFed.gid) && (pDVar11->dependent == true)) {
    responseSequenceCounter = (pDVar11->super_TimeData).sequenceCounter;
    GVar14.gid = triggerFed.gid;
  }
  else {
    pDVar12 = TimeDependencies::getDependencyInfo(this_00,triggerFed);
    if (pDVar12->dependent != true) {
      return CONTINUE_PROCESSING;
    }
    GVar14.gid = (pDVar11->fedID).gid;
    responseSequenceCounter = (pDVar12->super_TimeData).sequenceCounter;
  }
LAB_002dc0bc:
  sendUpdatedExecRequest(this,triggerFed,GVar14,responseSequenceCounter);
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkExecEntry(GlobalFederateId triggerFed)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (time_block <= timeZero) {
        return ret;
    }
    if (!dependencies.checkIfReadyForExecEntry(iterating != IterationRequest::NO_ITERATIONS,
                                               info.wait_for_current_time_updates)) {
        if (!hasInitUpdates) {
            if (triggerFed.isValid() && iterating != IterationRequest::NO_ITERATIONS) {
                if (dependencies.checkIfReadyForExecEntry(false, false)) {
                    // if we are just continuing but would have granted in other circumstances
                    const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
                    if (mfed.fedID == triggerFed) {
                        sendUpdatedExecRequest(triggerFed,
                                               GlobalFederateId{},
                                               mfed.sequenceCounter);
                    } else {
                        const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                        if (tfed->dependent) {
                            sendUpdatedExecRequest(triggerFed,
                                                   GlobalFederateId{},
                                                   tfed->sequenceCounter);
                        }
                    }
                } else {
                    needSendAll = true;
                }
            }
        }
        return ret;
    }
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (!info.wait_for_current_time_updates) {
                ret = MessageProcessingResult::NEXT_STEP;
            } else {
                // on wait for current time flag all other federates must have entered exec mode
                total = generateMinTimeTotal(dependencies,
                                             info.restrictive_time_policy || globalTime,
                                             mSourceId,
                                             mSourceId,
                                             sequenceCounter);
                if (total.next > timeZero) {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (iteration >= info.maxIterations) {
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ret = MessageProcessingResult::ITERATING;
                } else {
                    ret = MessageProcessingResult::NEXT_STEP;
                }
                break;
            }
            if (hasInitUpdates) {
                ret = MessageProcessingResult::ITERATING;
            } else {
                if ((dependencies.checkIfReadyForExecEntry(false,
                                                           info.wait_for_current_time_updates)) ||
                    (info.wait_for_current_time_updates &&
                     dependencies.checkIfAllDependenciesArePastExec(true))) {
                    ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                        MessageProcessingResult::ITERATING :
                        MessageProcessingResult::NEXT_STEP;
                } else {
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.mTimeState == TimeState::initialized) {
                                allowed = false;
                                restrictionAdvance = false;
                                break;
                            }
                            if (dep.mTimeState >= TimeState::exec_requested) {
                                continue;
                            }
                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                    MessageProcessingResult::ITERATING :
                                    MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = (iterating == IterationRequest::FORCE_ITERATION) ?
                                MessageProcessingResult::ITERATING :
                                MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }
            break;
        default:
            break;
    }
    if (!dynamicJoining) {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            time_granted = timeZero;
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        } else if (ret == MessageProcessingResult::ITERATING) {
            dependencies.resetIteratingExecRequests();
            hasInitUpdates = false;
            ++iteration;
            ActionMessage execgrant(CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.counter = iteration;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            setActionFlag(execgrant, iteration_requested_flag);
            transmitTimingMessages(execgrant);
            currentRestrictionLevel = 0;
        }
    } else {
        if (ret == MessageProcessingResult::NEXT_STEP) {
            updateTimeFactors();
            if (dependencyCount() > 0) {
                time_granted =
                    generateAllowedTime(total.next) - (std::max)(info.period, info.timeDelta);
            } else {
                time_granted = timeZero;
            }
            time_grantBase = time_granted;
            executionMode = true;
            iteration = 0;
            currentRestrictionLevel = 0;
            ActionMessage execgrant(time_granted > timeZero ? CMD_TIME_GRANT : CMD_EXEC_GRANT);
            execgrant.source_id = mSourceId;
            execgrant.actionTime = time_granted;
            execgrant.setExtraDestData(TIME_COORDINATOR_VERSION);  // version
            transmitTimingMessages(execgrant);
        }
    }
    if (triggerFed.isValid() && ret == MessageProcessingResult::CONTINUE_PROCESSING &&
        iterating != IterationRequest::NO_ITERATIONS) {
        // if we are just continuing
        const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
        if (sendAll) {
            sendUpdatedExecRequest(GlobalFederateId{}, mfed.fedID, mfed.sequenceCounter);
        } else {
            if (triggerFed != mSourceId) {
                if (triggerFed == mfed.fedID && mfed.dependent) {
                    sendUpdatedExecRequest(triggerFed, mfed.fedID, mfed.sequenceCounter);
                } else {
                    const auto* tfed = dependencies.getDependencyInfo(triggerFed);
                    if (tfed->dependent) {
                        sendUpdatedExecRequest(triggerFed, mfed.fedID, tfed->sequenceCounter);
                    }
                }
            }
        }
    }
    return ret;
}